

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O3

JL_STATUS JlGetObjectNumberF64(JlDataObject *NumberObject,double *pNumberF64)

{
  undefined8 uVar1;
  JL_NUM_TYPE JVar2;
  JL_STATUS JVar3;
  anon_union_8_3_eb7f4dc6_for_JlNumber_1 aVar4;
  
  if (pNumberF64 == (double *)0x0 || NumberObject == (JlDataObject *)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  JVar3 = JL_STATUS_WRONG_TYPE;
  aVar4.u64 = 0;
  if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
    JVar2 = (NumberObject->field_2).Number.Type;
    if (JVar2 == JL_NUM_TYPE_UNSIGNED) {
      uVar1 = *(undefined8 *)((long)&NumberObject->field_2 + 8);
      aVar4.f64 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25
                  ) + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    }
    else if (JVar2 == JL_NUM_TYPE_SIGNED) {
      aVar4.f64 = (double)(long)(NumberObject->field_2).List.ListHead;
    }
    else {
      if (JVar2 != JL_NUM_TYPE_FLOAT) goto LAB_00101ef0;
      aVar4 = (NumberObject->field_2).Number.field_1;
    }
    JVar3 = JL_STATUS_SUCCESS;
  }
LAB_00101ef0:
  *pNumberF64 = (double)aVar4;
  return JVar3;
}

Assistant:

JL_STATUS
    JlGetObjectNumberF64
    (
        JlDataObject const* NumberObject,
        double*             pNumberF64
    )
{
    JL_STATUS jlStatus;

    if(     NULL != NumberObject
        &&  NULL != pNumberF64 )
    {
        if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_FLOAT == NumberObject->Number.Type )
        {
            // Number stored as a double. Easy.
            *pNumberF64 = NumberObject->Number.f64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_UNSIGNED == NumberObject->Number.Type )
        {
            // Convert from uint64_t to double. Precision may be lost.
            *pNumberF64 = (double)(NumberObject->Number.u64);
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_SIGNED == NumberObject->Number.Type )
        {
            // Convert from int64_t to double. Precision may be lost.
            *pNumberF64 = (double)(NumberObject->Number.s64);
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            *pNumberF64 = 0.0;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}